

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error __thiscall
asmjit::X86FuncArgsContext::markStackArgsReg(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  uint uVar1;
  undefined4 uVar2;
  Error EVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  undefined1 uVar8;
  undefined7 uVar9;
  int iVar10;
  bool bVar11;
  
  uVar8 = SUB81(ffi,0);
  uVar9 = (undefined7)((ulong)ffi >> 8);
  if (this->_hasStackArgs != true) {
    return 0;
  }
  if ((ffi->_attributes & 1) != 0) {
    ffi->_stackArgsRegId = '\x05';
    return 0;
  }
  bVar4 = ffi->_stackArgsRegId;
  uVar5 = this->_workData[0].usedRegs;
  if (bVar4 == 0xff) {
    uVar1 = this->_workData[0].workRegs;
    uVar7 = ~(this->_workData[0].dstRegs | uVar5) & uVar1;
    uVar5 = ~uVar5 & uVar1;
    if (uVar7 != 0) {
      uVar5 = uVar7;
    }
    uVar1 = ~uVar1 & this->_workData[0].archRegs;
    if (uVar5 != 0) {
      uVar1 = uVar5;
    }
    EVar3 = 0x35;
    bVar11 = uVar1 == 0;
    if (!bVar11) {
      iVar10 = 0;
      if (uVar1 != 0) {
        for (; (uVar1 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      ffi->_stackArgsRegId = (uint8_t)iVar10;
    }
LAB_0012193f:
    if (!bVar11) {
      return 0;
    }
    return EVar3;
  }
  if (bVar4 < 0x20) {
    bVar11 = (uVar5 >> (bVar4 & 0x1f) & 1) != 0;
    EVar3 = 0x37;
    goto LAB_0012193f;
  }
  markStackArgsReg();
  EVar3 = 3;
  switch((int)CONCAT71(uVar9,uVar8)) {
  case 0x10:
    break;
  case 0x11:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    break;
  case 0x12:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    this->_workData[0].usedRegs = 0xffffff01;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x02';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x13:
  case 0x14:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 3) = 1;
    this->_workData[0].usedRegs = 0xffff0201;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x06';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x15:
    this->_workData[0].usedRegs = 0xffffff00;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x01';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x16:
    this->_workData[0].usedRegs = 0xffff0200;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\x05';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  case 0x17:
    this->_workData[0].usedRegs = 0xff010200;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].argIndex[8] = '\a';
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    break;
  default:
    goto switchD_0012196b_caseD_18;
  case 0x1d:
  case 0x1e:
  case 0x1f:
    uVar5 = (int)CONCAT71(uVar9,uVar8) - 0x1d;
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 1;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    this->_workData[0].argIndex[8] = 199;
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].reserved[1] = '\0';
    this->_workData[0].reserved[2] = '\x01';
    this->_workData[0].reserved[3] = '\x02';
    this->_workData[0].reserved[4] = '\x03';
    this->_workData[0].reserved[5] = '\x04';
    this->_workData[0].reserved[6] = '\x05';
    this->_workData[0].reserved[7] = '\x06';
    this->_workData[0].reserved[8] = '\a';
    this->_workData[0].usedRegs = 0x6010200;
    this->_workData[0].srcRegs = 0xffffff07;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].argIndex[0x10] = 0xff;
    this->_workData[0].argIndex[0x11] = '\0';
    this->_workData[0].argIndex[0x12] = '\0';
    this->_workData[0].argIndex[0x13] = '\0';
    bVar4 = (byte)uVar5;
    iVar10 = 0;
    if (uVar5 < 0x20) {
      iVar10 = (0xffU >> (bVar4 & 0x1f)) << (bVar4 & 0x1f);
    }
    this->_workData[0].argIndex[0x18] = 0xff;
    this->_workData[0].argIndex[0x19] = '\0';
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    *(int *)(this->_workData[0].argIndex + 0x1c) = iVar10;
    this->_workData[1].archRegs = 0xff;
    goto LAB_00121a2c;
  case 0x20:
    *(undefined4 *)((long)&this->_workData[0].archRegs + 1) = 0x100a0102;
    *(undefined1 *)((long)&this->_workData[0].workRegs + 1) = 0x20;
    this->_workData[0].argIndex[8] = '\x06';
    this->_workData[0].argIndex[9] = '\x03';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].argIndex[0xc] = '\x0f';
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].usedRegs = 0x9080201;
    this->_workData[0].srcRegs = 0xffffffff;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = 0xff;
    this->_workData[0].numSwaps = 0xff;
    this->_workData[0].numStackArgs = 0xff;
    this->_workData[0].reserved[0] = 0xff;
    this->_workData[0].argIndex[0x18] = 0xf8;
    this->_workData[0].argIndex[0x19] = 0xf0;
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    uVar2 = 0xffc0;
    lVar6 = 0x3c;
    goto LAB_00121b16;
  case 0x21:
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 2;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    *(undefined2 *)((long)&this->_workData[0].workRegs + 2) = 0x80;
    this->_workData[0].argIndex[8] = 0xc6;
    this->_workData[0].argIndex[9] = '\x03';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].usedRegs = 0x1020607;
    this->_workData[0].srcRegs = 0xffff0908;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    uVar2 = 0xf038;
    goto LAB_00121b11;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar5 = (int)CONCAT71(uVar9,uVar8) - 0x2d;
    *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 2;
    *(undefined2 *)((long)&this->_workData[0].archRegs + 3) = 0x1002;
    this->_workData[0].argIndex[8] = 199;
    this->_workData[0].argIndex[9] = '\0';
    this->_workData[0].argIndex[10] = '\0';
    this->_workData[0].argIndex[0xb] = '\0';
    this->_workData[0].reserved[1] = '\0';
    this->_workData[0].reserved[2] = '\x01';
    this->_workData[0].reserved[3] = '\x02';
    this->_workData[0].reserved[4] = '\x03';
    this->_workData[0].reserved[5] = '\x04';
    this->_workData[0].reserved[6] = '\x05';
    this->_workData[0].reserved[7] = '\x06';
    this->_workData[0].reserved[8] = '\a';
    this->_workData[0].usedRegs = 0x6010200;
    this->_workData[0].srcRegs = 0xffffff07;
    this->_workData[0].dstRegs = 0x3020100;
    this->_workData[0].numOps = '\x04';
    this->_workData[0].numSwaps = '\x05';
    this->_workData[0].numStackArgs = '\x06';
    this->_workData[0].reserved[0] = '\a';
    this->_workData[0].argIndex[0xc] = 0xff;
    this->_workData[0].argIndex[0xd] = '\0';
    this->_workData[0].argIndex[0xe] = '\0';
    this->_workData[0].argIndex[0xf] = '\0';
    this->_workData[0].argIndex[0x10] = 0xff;
    this->_workData[0].argIndex[0x11] = '\0';
    this->_workData[0].argIndex[0x12] = '\0';
    this->_workData[0].argIndex[0x13] = '\0';
    this->_workData[0].argIndex[0x18] = 0xff;
    this->_workData[0].argIndex[0x19] = 0xff;
    this->_workData[0].argIndex[0x1a] = '\0';
    this->_workData[0].argIndex[0x1b] = '\0';
    iVar10 = 0;
    if (uVar5 < 0x20) {
      iVar10 = -1 << ((byte)uVar5 & 0x1f);
    }
    *(int *)(this->_workData[0].argIndex + 0x1c) = iVar10;
    this->_workData[1].archRegs = 0xff;
LAB_00121a2c:
    uVar2 = 0xff;
    lVar6 = 0x44;
    goto LAB_00121b16;
  }
  *(undefined1 *)&this->_workData[0].workRegs = 4;
  *(undefined1 *)((long)&this->_workData[0].archRegs + 1) = 1;
  uVar2 = 0xf8;
LAB_00121b11:
  lVar6 = 0x38;
LAB_00121b16:
  *(undefined4 *)(this->_workData[0].reserved + lVar6 + -0x17) = uVar2;
  *(undefined1 *)&this->_workData[0].archRegs = uVar8;
  EVar3 = 0;
switchD_0012196b_caseD_18:
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markStackArgsReg(FuncFrameInfo& ffi) noexcept {
  if (!_hasStackArgs)
    return kErrorOk;

  // Decide which register to use to hold the stack base address.
  if (!ffi.hasPreservedFP()) {
    WorkData& wd = _workData[X86Reg::kKindGp];
    uint32_t saRegId = ffi.getStackArgsRegId();
    uint32_t usedRegs = wd.usedRegs;

    if (saRegId != Globals::kInvalidRegId) {
      // Check if the user chosen SA register doesn't overlap with others.
      // However, it's fine if it overlaps with some 'dstMove' register.
      if (usedRegs & Utils::mask(saRegId))
        return DebugUtils::errored(kErrorOverlappingStackRegWithRegArg);
    }
    else {
      // Initially, pick some clobbered or dirty register that is neither
      // in 'used' and neither in 'dstMove'. That's the safest bet as the
      // register won't collide with anything right now.
      uint32_t regs = wd.workRegs & ~(usedRegs | wd.dstRegs);

      // If that didn't work out pick some register which is not in 'used'.
      if (!regs) regs = wd.workRegs & ~usedRegs;

      // If that didn't work out then we have to make one more register dirty.
      if (!regs) regs = wd.archRegs & ~wd.workRegs;

      // If that didn't work out we can't continue.
      if (ASMJIT_UNLIKELY(!regs))
        return DebugUtils::errored(kErrorNoMorePhysRegs);

      saRegId = Utils::findFirstBit(regs);
      ffi.setStackArgsRegId(saRegId);
    }
  }
  else {
    ffi.setStackArgsRegId(X86Gp::kIdBp);
  }

  return kErrorOk;
}